

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Begin
          (ByteCodeWriter *this,FunctionBody *functionWrite,ArenaAllocator *alloc,
          bool doJitLoopBodies,bool hasLoop,bool inDebugMode)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  ByteBlock *pBVar5;
  ScriptContext *pSVar6;
  
  if (this->isInUse == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x48,"(!isInUse)","!isInUse");
    if (!bVar2) goto LAB_0088b4ad;
    *puVar4 = 0;
  }
  if (this->m_functionWrite != (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x49,"(m_functionWrite == nullptr)","Cannot nest Begin() calls");
    if (!bVar2) goto LAB_0088b4ad;
    *puVar4 = 0;
  }
  if (functionWrite == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4a,"(functionWrite != nullptr)",
                                "Must have valid function to write");
    if (!bVar2) goto LAB_0088b4ad;
    *puVar4 = 0;
  }
  pBVar5 = FunctionBody::GetByteCode(functionWrite);
  if (pBVar5 != (ByteBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4b,"(functionWrite->GetByteCode() == nullptr)",
                                "Function should not already have a byte-code body");
    if (!bVar2) goto LAB_0088b4ad;
    *puVar4 = 0;
  }
  RVar3 = FunctionBody::GetLocalsCount(functionWrite);
  if (RVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4c,"(functionWrite->GetLocalsCount() > 0)",
                                "Must always have R0 for return-value");
    if (!bVar2) {
LAB_0088b4ad:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->isInUse = true;
  this->m_functionWrite = functionWrite;
  this->m_doJitLoopBodies = doJitLoopBodies;
  pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionWrite);
  bVar2 = ThreadContext::DoInterruptProbe(pSVar6->threadContext,functionWrite);
  this->m_doInterruptProbe = bVar2;
  this->m_hasLoop = hasLoop;
  this->m_isInDebugMode = inDebugMode;
  return;
}

Assistant:

void ByteCodeWriter::Begin(FunctionBody* functionWrite, ArenaAllocator* alloc, bool doJitLoopBodies, bool hasLoop, bool inDebugMode)
    {
        Assert(!isInUse);
        AssertMsg(m_functionWrite == nullptr, "Cannot nest Begin() calls");
        AssertMsg(functionWrite != nullptr, "Must have valid function to write");
        AssertMsg(functionWrite->GetByteCode() == nullptr, "Function should not already have a byte-code body");
        AssertMsg(functionWrite->GetLocalsCount() > 0, "Must always have R0 for return-value");

        DebugOnly(isInUse = true);
        m_functionWrite = functionWrite;
        m_doJitLoopBodies = doJitLoopBodies;
        m_doInterruptProbe = functionWrite->GetScriptContext()->GetThreadContext()->DoInterruptProbe(functionWrite);
        m_hasLoop = hasLoop;
        m_isInDebugMode = inDebugMode;
    }